

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O2

void __thiscall ReportWriter::writeSavedResults(ReportWriter *this,OutputFile *outFile)

{
  int iVar1;
  pointer ppNVar2;
  Node *node;
  pointer ppLVar3;
  Link *link;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  uint uVar8;
  pointer ppNVar9;
  pointer ppLVar10;
  undefined1 local_70 [8];
  string theTime;
  
  iVar5 = outFile->timePeriodCount;
  iVar1 = outFile->reportStep;
  OutputFile::seekNetworkOffset(outFile);
  uVar8 = outFile->reportStart;
  theTime.field_2._8_8_ = outFile->nodeResults;
  iVar4 = 0;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  uVar7 = extraout_RDX;
  for (iVar5 = 1; iVar5 != iVar4 + 1; iVar5 = iVar5 + 1) {
    Utilities::getTime_abi_cxx11_((string *)local_70,(Utilities *)(ulong)uVar8,(int)uVar7);
    if ((this->network->options).indexOptions[0xf] == 0) {
      OutputFile::skipNodeResults(outFile);
    }
    else {
      poVar6 = (ostream *)this->sout;
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"  Node Results at ");
      poVar6 = std::operator<<(poVar6,(string *)local_70);
      poVar6 = std::operator<<(poVar6," hrs");
      std::endl<char,std::char_traits<char>>(poVar6);
      writeNodeHeader(this);
      ppNVar2 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar2;
          ppNVar9 = ppNVar9 + 1) {
        node = *ppNVar9;
        OutputFile::readNodeResults(outFile);
        writeNodeResults(this,node,(float *)theTime.field_2._8_8_);
      }
    }
    if ((this->network->options).indexOptions[0x10] == 0) {
      OutputFile::skipLinkResults(outFile);
    }
    else {
      poVar6 = (ostream *)this->sout;
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"  Link Results at ");
      poVar6 = std::operator<<(poVar6,(string *)local_70);
      poVar6 = std::operator<<(poVar6," hrs");
      std::endl<char,std::char_traits<char>>(poVar6);
      writeLinkHeader(this);
      ppLVar3 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppLVar10 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppLVar10 != ppLVar3;
          ppLVar10 = ppLVar10 + 1) {
        link = *ppLVar10;
        OutputFile::readLinkResults(outFile);
        writeLinkResults(this,link,outFile->linkResults);
      }
    }
    uVar8 = uVar8 + iVar1;
    std::__cxx11::string::~string((string *)local_70);
    uVar7 = extraout_RDX_00;
  }
  return;
}

Assistant:

void ReportWriter::writeSavedResults(OutputFile* outFile)
{
    int nPeriods = outFile->timePeriodCount;
    int reportStep = outFile->reportStep;
    outFile->seekNetworkOffset();
    int t = outFile->reportStart;
    for (int i = 1; i <= nPeriods; i++)
    {
        string theTime = Utilities::getTime(t);

        if (network->option(Options::REPORT_NODES))
        {
            sout << left;
            sout << endl << endl << "  Node Results at " << theTime << " hrs" << endl;
            writeNodeHeader();
            for (Node* node : network->nodes)
            {
                outFile->readNodeResults();
                writeNodeResults(node, outFile->nodeResults);
            }
        }
        else outFile->skipNodeResults();

        if (network->option(Options::REPORT_LINKS))
        {
            sout << left;
            sout << endl << endl << "  Link Results at " << theTime << " hrs" << endl;
            writeLinkHeader();
            for (Link* link : network->links)
            {
                outFile->readLinkResults();
                writeLinkResults(link, outFile->linkResults);
            }
        }
        else outFile->skipLinkResults();

        t += reportStep;
    }
}